

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service_test.cxx
# Opt level: O0

string * asio_service_test::test_write_empty_meta_abi_cxx11_
                   (atomic<unsigned_long> *count,meta_cb_params *params)

{
  __atomic_base<unsigned_long> *in_RSI;
  string *in_RDI;
  
  if (in_RSI != (__atomic_base<unsigned_long> *)0x0) {
    std::__atomic_base<unsigned_long>::operator++(in_RSI,0);
  }
  std::__cxx11::string::string(in_RDI);
  return in_RDI;
}

Assistant:

std::string test_write_empty_meta( std::atomic<size_t>* count,
                                   const asio_service::meta_cb_params& params )
{
    if (count) (*count)++;
    return std::string();
}